

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregates.cpp
# Opt level: O0

BVHBuildNode * __thiscall
pbrt::BVHAggregate::buildRecursive
          (BVHAggregate *this,
          vector<pstd::pmr::polymorphic_allocator<std::byte>,_std::allocator<pstd::pmr::polymorphic_allocator<std::byte>_>_>
          *threadAllocators,
          vector<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_> *bvhPrimitives,int start,
          int end,atomic<int> *totalNodes,atomic<int> *orderedPrimsOffset,
          vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_> *orderedPrims)

{
  undefined1 auVar1 [16];
  anon_class_32_3_58f29f95 __pred;
  int *piVar2;
  reference pvVar3;
  reference pvVar4;
  float *pfVar5;
  BVHPrimitive *pBVar6;
  int in_ECX;
  long lVar7;
  vector<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_> *in_RDX;
  BVHAggregate *in_RSI;
  int *in_RDI;
  int in_R8D;
  __atomic_base<int> *in_R9;
  float fVar8;
  float fVar9;
  undefined1 auVar10 [64];
  undefined1 auVar11 [56];
  Vector3<float> VVar12;
  atomic<int> *unaff_retaddr;
  vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_> *in_stack_00000008;
  vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_> *in_stack_00000010;
  BVHBuildNode *children [2];
  int index_2;
  int i_8;
  int firstPrimOffset_2;
  BVHPrimitive *pmid_1;
  Float leafCost;
  Float cost;
  int i_7;
  Float minCost;
  int minCostSplitBucket;
  int i_6;
  int i_5;
  Bounds3f boundsAbove [11];
  Bounds3f boundsBelow [11];
  int countAbove [11];
  int countBelow [11];
  int nSplits;
  int b;
  int i_4;
  BVHSplitBucket buckets [12];
  int nBuckets;
  BVHPrimitive *midPtr;
  Float pmid;
  int index_1;
  int i_3;
  int firstPrimOffset_1;
  int mid;
  int dim;
  int i_2;
  Bounds3f centroidBounds;
  int index;
  int i_1;
  int firstPrimOffset;
  int nPrimitives;
  int i;
  Bounds3f bounds;
  BVHBuildNode *node;
  Allocator alloc;
  PrimitiveHandle *in_stack_fffffffffffff858;
  polymorphic_allocator<std::byte> *in_stack_fffffffffffff860;
  anon_class_80_10_2e0851f7 *in_stack_fffffffffffff868;
  BVHPrimitive *in_stack_fffffffffffff870;
  BVHBuildNode *in_stack_fffffffffffff878;
  anon_class_8_2_19ee5c4b in_stack_fffffffffffff880;
  BVHPrimitive *in_stack_fffffffffffff888;
  BVHBuildNode *in_stack_fffffffffffff890;
  reference in_stack_fffffffffffff8a0;
  BVHPrimitive *in_stack_fffffffffffff8a8;
  float in_stack_fffffffffffff8b0;
  float in_stack_fffffffffffff8b4;
  undefined8 *puVar13;
  undefined8 *puVar14;
  undefined8 *puVar15;
  undefined8 *local_718;
  int *local_6f8;
  undefined1 local_608 [32];
  BVHBuildNode *local_5e8;
  BVHBuildNode *local_5e0;
  int local_5cc;
  int local_5c8;
  int local_5c4;
  undefined1 local_5c0 [16];
  anon_class_80_10_2e0851f7 *local_5b0;
  int local_5a8;
  int iStack_5a4;
  BVHPrimitive *local_5a0;
  float local_594;
  float local_590;
  int local_58c;
  float local_588;
  int local_584;
  undefined8 local_580;
  undefined8 local_578;
  undefined8 local_570;
  int local_568;
  undefined8 local_564;
  undefined8 local_55c;
  undefined8 local_554;
  int local_54c;
  undefined8 local_548 [30];
  undefined8 local_458;
  undefined8 local_450;
  undefined8 local_448;
  undefined8 uStack_440;
  undefined8 local_438 [33];
  undefined8 uStack_330;
  int aiStack_328 [10];
  undefined4 local_300;
  int local_2f8 [11];
  undefined4 local_2cc;
  undefined8 local_2c8;
  undefined8 local_2c0;
  undefined8 local_2b8;
  Tuple3<pbrt::Vector3,_float> local_2b0;
  Tuple3<pbrt::Vector3,_float> local_29c;
  int local_290;
  int local_28c;
  int local_288;
  undefined8 local_284 [38];
  undefined4 local_154;
  undefined8 local_150;
  undefined8 local_148;
  undefined8 local_140;
  int aiStack_138 [3];
  int local_12c;
  int local_128;
  float fStack_124;
  BVHPrimitive *local_120;
  float local_118;
  int local_114;
  int local_110;
  int local_10c;
  int local_108;
  int local_104;
  undefined1 local_100 [16];
  anon_class_80_10_2e0851f7 *local_f0;
  int local_e8;
  undefined1 local_e4 [12];
  undefined1 auStack_d8 [12];
  int local_cc;
  int local_c8;
  int local_c4;
  int local_c0;
  int local_a4;
  Bounds3f local_a0;
  BVHBuildNode *local_88;
  memory_resource *totalNodes_00;
  int iVar16;
  int iVar17;
  BVHAggregate *this_00;
  
  this_00 = in_RSI;
  piVar2 = (int *)ThreadIndex();
  pvVar3 = std::
           vector<pstd::pmr::polymorphic_allocator<std::byte>,_std::allocator<pstd::pmr::polymorphic_allocator<std::byte>_>_>
           ::operator[]((vector<pstd::pmr::polymorphic_allocator<std::byte>,_std::allocator<pstd::pmr::polymorphic_allocator<std::byte>_>_>
                         *)in_RSI,(long)*piVar2);
  totalNodes_00 = pvVar3->memoryResource;
  local_88 = pstd::pmr::polymorphic_allocator<std::byte>::new_object<pbrt::BVHBuildNode>
                       (in_stack_fffffffffffff860);
  std::__atomic_base<int>::operator++(in_R9);
  local_a4 = in_ECX;
  Bounds3<float>::Bounds3((Bounds3<float> *)in_stack_fffffffffffff880);
  local_c8 = local_a4;
  for (; local_a4 < in_R8D; local_a4 = local_a4 + 1) {
    std::vector<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_>::operator[]
              (in_RDX,(long)local_a4);
    Union<float>((Bounds3<float> *)CONCAT44(in_stack_fffffffffffff8b4,in_stack_fffffffffffff8b0),
                 (Bounds3<float> *)in_stack_fffffffffffff8a8);
  }
  local_c0 = in_R8D - local_c8;
  fVar8 = Bounds3<float>::SurfaceArea((Bounds3<float> *)in_stack_fffffffffffff870);
  if (((fVar8 == 0.0) && (!NAN(fVar8))) || (local_c0 == 1)) {
    LOCK();
    local_c4 = *(int *)&(in_stack_00000008->
                        super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>
                        )._M_impl.super__Vector_impl_data._M_start;
    *(int *)&(in_stack_00000008->
             super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>).
             _M_impl.super__Vector_impl_data._M_start =
         *(int *)&(in_stack_00000008->
                  super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>)
                  ._M_impl.super__Vector_impl_data._M_start + local_c0;
    UNLOCK();
    iVar17 = local_c8;
    for (; local_c8 < in_R8D; local_c8 = local_c8 + 1) {
      pvVar4 = std::vector<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_>::operator[]
                         (in_RDX,(long)local_c8);
      local_cc = (int)pvVar4->primitiveIndex;
      std::vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>::operator[]
                ((vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_> *)
                 (in_RDI + 2),(long)local_cc);
      std::vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>::operator[]
                (in_stack_00000010,(long)((local_c4 + local_c8) - iVar17));
      PrimitiveHandle::operator=
                ((PrimitiveHandle *)in_stack_fffffffffffff860,in_stack_fffffffffffff858);
    }
    BVHBuildNode::InitLeaf(local_88,local_c4,local_c0,&local_a0);
    return local_88;
  }
  local_e8 = local_c8;
  Bounds3<float>::Bounds3((Bounds3<float> *)in_stack_fffffffffffff880);
  local_110 = local_e8;
  for (; local_e8 < in_R8D; local_e8 = local_e8 + 1) {
    std::vector<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_>::operator[]
              (in_RDX,(long)local_e8);
    Union<float>((Bounds3<float> *)CONCAT44(in_stack_fffffffffffff8b4,in_stack_fffffffffffff8b0),
                 (Point3<float> *)in_stack_fffffffffffff8a8);
    local_e4._0_4_ = (float)local_100._0_4_;
    local_e4._4_4_ = (float)local_100._4_4_;
    unique0x00012000 = local_100._8_8_;
    auStack_d8._4_8_ = local_f0;
  }
  local_104 = Bounds3<float>::MaxDimension(&in_stack_fffffffffffff878->bounds);
  local_108 = (local_110 + in_R8D) / 2;
  pfVar5 = Tuple3<pbrt::Point3,_float>::operator[]
                     ((Tuple3<pbrt::Point3,_float> *)auStack_d8,local_104);
  fVar8 = *pfVar5;
  pfVar5 = Tuple3<pbrt::Point3,_float>::operator[]
                     ((Tuple3<pbrt::Point3,_float> *)local_e4,local_104);
  auVar10 = ZEXT464((uint)fVar8);
  if ((fVar8 == *pfVar5) && (!NAN(fVar8) && !NAN(*pfVar5))) {
    LOCK();
    local_10c = *(int *)&(in_stack_00000008->
                         super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>
                         )._M_impl.super__Vector_impl_data._M_start;
    *(int *)&(in_stack_00000008->
             super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>).
             _M_impl.super__Vector_impl_data._M_start =
         *(int *)&(in_stack_00000008->
                  super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>)
                  ._M_impl.super__Vector_impl_data._M_start + local_c0;
    UNLOCK();
    iVar17 = local_110;
    for (; local_110 < in_R8D; local_110 = local_110 + 1) {
      pvVar4 = std::vector<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_>::operator[]
                         (in_RDX,(long)local_110);
      local_114 = (int)pvVar4->primitiveIndex;
      std::vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>::operator[]
                ((vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_> *)
                 (in_RDI + 2),(long)local_114);
      std::vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>::operator[]
                (in_stack_00000010,(long)((local_10c + local_110) - iVar17));
      PrimitiveHandle::operator=
                ((PrimitiveHandle *)in_stack_fffffffffffff860,in_stack_fffffffffffff858);
    }
    BVHBuildNode::InitLeaf(local_88,local_10c,local_c0,&local_a0);
    return local_88;
  }
  iVar17 = in_RDI[8];
  if (iVar17 == 0) {
LAB_007bbbba:
    if (local_c0 < 3) {
      local_108 = (local_110 + in_R8D) / 2;
      std::vector<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_>::operator[]
                (in_RDX,(long)local_110);
      std::vector<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_>::operator[]
                (in_RDX,(long)local_108);
      std::vector<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_>::operator[]
                (in_RDX,(long)(in_R8D + -1));
      aiStack_138[2] = local_104;
      std::
      nth_element<pbrt::BVHPrimitive*,pbrt::BVHAggregate::buildRecursive(std::vector<pstd::pmr::polymorphic_allocator<std::byte>,std::allocator<pstd::pmr::polymorphic_allocator<std::byte>>>&,std::vector<pbrt::BVHPrimitive,std::allocator<pbrt::BVHPrimitive>>&,int,int,std::atomic<int>*,std::atomic<int>*,std::vector<pbrt::PrimitiveHandle,std::allocator<pbrt::PrimitiveHandle>>&)::__3>
                (in_stack_fffffffffffff888,(BVHPrimitive *)in_stack_fffffffffffff880,
                 (BVHPrimitive *)in_stack_fffffffffffff878,
                 (anon_class_4_1_ba1d3fe8)(int)((ulong)in_stack_fffffffffffff890 >> 0x20));
      auStack_d8._4_8_ = in_stack_fffffffffffff868;
    }
    else {
      aiStack_138[1] = 0xc;
      local_6f8 = &local_288;
      local_28c = local_110;
      do {
        BVHSplitBucket::BVHSplitBucket((BVHSplitBucket *)0x7bbcb1);
        local_6f8 = local_6f8 + 7;
        iVar17 = local_28c;
      } while (local_6f8 != aiStack_138);
      for (; auVar11 = auVar10._8_56_, local_28c < in_R8D; local_28c = local_28c + 1) {
        std::vector<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_>::operator[]
                  (in_RDX,(long)local_28c);
        VVar12 = Bounds3<float>::Offset
                           ((Bounds3<float> *)in_stack_fffffffffffff880,
                            (Point3<float> *)in_stack_fffffffffffff878);
        local_2b0.z = VVar12.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar10._0_8_ = VVar12.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        auVar10._8_56_ = auVar11;
        local_2b0._0_8_ = vmovlpd_avx(auVar10._0_16_);
        local_29c._0_8_ = local_2b0._0_8_;
        local_29c.z = local_2b0.z;
        pfVar5 = Tuple3<pbrt::Vector3,_float>::operator[](&local_29c,local_104);
        auVar10 = ZEXT464((uint)(*pfVar5 * 12.0));
        local_290 = (int)(*pfVar5 * 12.0);
        if (local_290 == 0xc) {
          local_290 = 0xb;
        }
        (&local_288)[(long)local_290 * 7] = (&local_288)[(long)local_290 * 7] + 1;
        std::vector<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_>::operator[]
                  (in_RDX,(long)local_28c);
        Union<float>((Bounds3<float> *)CONCAT44(in_stack_fffffffffffff8b4,in_stack_fffffffffffff8b0)
                     ,(Bounds3<float> *)in_stack_fffffffffffff8a8);
        lVar7 = (long)local_290 * 0x1c;
        *(undefined8 *)((long)local_284 + lVar7) = local_2c8;
        *(undefined8 *)((long)local_284 + lVar7 + 8) = local_2c0;
        *(undefined8 *)((long)local_284 + lVar7 + 0x10) = local_2b8;
      }
      local_2cc = 0xb;
      puVar15 = local_438;
      do {
        local_718 = puVar15;
        Bounds3<float>::Bounds3((Bounds3<float> *)in_stack_fffffffffffff880);
        puVar15 = local_718 + 3;
      } while (local_718 + 3 != &uStack_330);
      puVar14 = &uStack_440;
      puVar15 = local_548;
      do {
        puVar13 = puVar15;
        Bounds3<float>::Bounds3((Bounds3<float> *)in_stack_fffffffffffff880);
        puVar15 = puVar13 + 3;
      } while (puVar15 != puVar14);
      local_2f8[0] = local_288;
      local_438[0] = local_284[0];
      local_438[1] = local_284[1];
      local_438[2] = local_284[2];
      for (local_54c = 1; local_54c < 0xb; local_54c = local_54c + 1) {
        local_2f8[local_54c] = local_2f8[local_54c + -1] + (&local_288)[(long)local_54c * 7];
        Union<float>((Bounds3<float> *)CONCAT44(in_stack_fffffffffffff8b4,in_stack_fffffffffffff8b0)
                     ,(Bounds3<float> *)in_stack_fffffffffffff8a8);
        lVar7 = (long)local_54c;
        local_438[lVar7 * 3] = local_564;
        local_438[lVar7 * 3 + 1] = local_55c;
        local_438[lVar7 * 3 + 2] = local_554;
      }
      local_300 = local_154;
      local_458 = local_150;
      local_450 = local_148;
      local_448 = local_140;
      for (local_568 = 9; -1 < local_568; local_568 = local_568 + -1) {
        aiStack_328[local_568] =
             aiStack_328[local_568 + 1] + (&local_288)[(long)(local_568 + 1) * 7];
        Union<float>((Bounds3<float> *)CONCAT44(in_stack_fffffffffffff8b4,in_stack_fffffffffffff8b0)
                     ,(Bounds3<float> *)in_stack_fffffffffffff8a8);
        lVar7 = (long)local_568;
        local_548[lVar7 * 3] = local_580;
        local_548[lVar7 * 3 + 1] = local_578;
        local_548[lVar7 * 3 + 2] = local_570;
      }
      local_584 = -1;
      local_588 = INFINITY;
      local_5c8 = iVar17;
      for (local_58c = 0; local_58c < 0xb; local_58c = local_58c + 1) {
        if ((local_2f8[local_58c] != 0) && (aiStack_328[local_58c] != 0)) {
          iVar17 = local_2f8[local_58c];
          fVar8 = Bounds3<float>::SurfaceArea((Bounds3<float> *)in_stack_fffffffffffff870);
          in_stack_fffffffffffff8b4 = (float)aiStack_328[local_58c];
          fVar9 = Bounds3<float>::SurfaceArea((Bounds3<float> *)in_stack_fffffffffffff870);
          auVar1 = vfmadd213ss_fma(ZEXT416((uint)fVar8),ZEXT416((uint)(float)iVar17),
                                   ZEXT416((uint)(in_stack_fffffffffffff8b4 * fVar9)));
          local_590 = auVar1._0_4_;
          if (local_590 < local_588) {
            local_584 = local_58c;
            local_588 = local_590;
          }
        }
      }
      local_594 = (float)local_c0;
      fVar8 = Bounds3<float>::SurfaceArea((Bounds3<float> *)in_stack_fffffffffffff870);
      fVar8 = local_588 / fVar8 + 0.5;
      if ((local_c0 <= *in_RDI) && (local_594 <= fVar8)) {
        LOCK();
        local_5c4 = *(int *)&(in_stack_00000008->
                             super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>
                             )._M_impl.super__Vector_impl_data._M_start;
        *(int *)&(in_stack_00000008->
                 super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>).
                 _M_impl.super__Vector_impl_data._M_start =
             *(int *)&(in_stack_00000008->
                      super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>
                      )._M_impl.super__Vector_impl_data._M_start + local_c0;
        UNLOCK();
        local_588 = fVar8;
        iVar17 = local_5c8;
        for (; local_5c8 < in_R8D; local_5c8 = local_5c8 + 1) {
          pvVar4 = std::vector<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_>::operator[]
                             (in_RDX,(long)local_5c8);
          local_5cc = (int)pvVar4->primitiveIndex;
          std::vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>::operator[]
                    ((vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_> *)
                     (in_RDI + 2),(long)local_5cc);
          std::vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>::operator[]
                    (in_stack_00000010,(long)((local_5c4 + local_5c8) - iVar17));
          PrimitiveHandle::operator=
                    ((PrimitiveHandle *)in_stack_fffffffffffff860,in_stack_fffffffffffff858);
        }
        BVHBuildNode::InitLeaf(local_88,local_5c4,local_c0,&local_a0);
        return local_88;
      }
      in_stack_fffffffffffff8b0 = local_588;
      local_588 = fVar8;
      in_stack_fffffffffffff8a0 =
           std::vector<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_>::operator[]
                     (in_RDX,(long)local_5c8);
      std::vector<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_>::operator[]
                (in_RDX,(long)(in_R8D + -1));
      local_5c0._0_8_ = local_e4._0_8_;
      local_5c0._8_8_ = stack0xffffffffffffff24;
      local_5b0 = (anon_class_80_10_2e0851f7 *)auStack_d8._4_8_;
      local_5a8 = local_104;
      iStack_5a4 = local_584;
      in_stack_fffffffffffff870 = (BVHPrimitive *)CONCAT44(local_584,local_104);
      __pred.centroidBounds._8_8_ = puVar14;
      __pred.centroidBounds.pMin.super_Tuple3<pbrt::Point3,_float>._0_8_ = puVar13;
      __pred.centroidBounds.pMax.super_Tuple3<pbrt::Point3,_float>._4_8_ = puVar15;
      __pred._24_8_ = local_718;
      in_stack_fffffffffffff8a8 =
           std::
           partition<pbrt::BVHPrimitive*,pbrt::BVHAggregate::buildRecursive(std::vector<pstd::pmr::polymorphic_allocator<std::byte>,std::allocator<pstd::pmr::polymorphic_allocator<std::byte>>>&,std::vector<pbrt::BVHPrimitive,std::allocator<pbrt::BVHPrimitive>>&,int,int,std::atomic<int>*,std::atomic<int>*,std::vector<pbrt::PrimitiveHandle,std::allocator<pbrt::PrimitiveHandle>>&)::__4>
                     ((BVHPrimitive *)CONCAT44(in_stack_fffffffffffff8b4,in_stack_fffffffffffff8b0),
                      in_stack_fffffffffffff8a8,__pred);
      local_5a0 = in_stack_fffffffffffff8a8;
      pvVar4 = std::vector<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_>::operator[]
                         (in_RDX,0);
      local_108 = (int)(((long)in_stack_fffffffffffff8a8 - (long)pvVar4) / 0x30);
      local_110 = local_5c8;
    }
  }
  else {
    if (iVar17 == 2) {
      pfVar5 = Tuple3<pbrt::Point3,_float>::operator[]
                         ((Tuple3<pbrt::Point3,_float> *)local_e4,local_104);
      fVar8 = *pfVar5;
      pfVar5 = Tuple3<pbrt::Point3,_float>::operator[]
                         ((Tuple3<pbrt::Point3,_float> *)auStack_d8,local_104);
      local_118 = (fVar8 + *pfVar5) / 2.0;
      std::vector<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_>::operator[]
                (in_RDX,(long)local_110);
      std::vector<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_>::operator[]
                (in_RDX,(long)(in_R8D + -1));
      local_128 = local_104;
      fStack_124 = local_118;
      pBVar6 = std::
               partition<pbrt::BVHPrimitive*,pbrt::BVHAggregate::buildRecursive(std::vector<pstd::pmr::polymorphic_allocator<std::byte>,std::allocator<pstd::pmr::polymorphic_allocator<std::byte>>>&,std::vector<pbrt::BVHPrimitive,std::allocator<pbrt::BVHPrimitive>>&,int,int,std::atomic<int>*,std::atomic<int>*,std::vector<pbrt::PrimitiveHandle,std::allocator<pbrt::PrimitiveHandle>>&)::__1>
                         ((BVHPrimitive *)in_stack_fffffffffffff878,in_stack_fffffffffffff870,
                          in_stack_fffffffffffff880);
      local_120 = pBVar6;
      pvVar4 = std::vector<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_>::operator[]
                         (in_RDX,0);
      local_108 = (int)(((long)pBVar6 - (long)pvVar4) / 0x30);
      iVar16 = local_110;
      if ((local_108 != local_110) &&
         (auStack_d8._4_8_ = in_stack_fffffffffffff868, local_108 != in_R8D)) goto LAB_007bc5e7;
    }
    else {
      iVar16 = local_110;
      if (iVar17 != 3) goto LAB_007bbbba;
    }
    local_108 = (iVar16 + in_R8D) / 2;
    std::vector<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_>::operator[]
              (in_RDX,(long)iVar16);
    std::vector<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_>::operator[]
              (in_RDX,(long)local_108);
    std::vector<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_>::operator[]
              (in_RDX,(long)(in_R8D + -1));
    local_12c = local_104;
    std::
    nth_element<pbrt::BVHPrimitive*,pbrt::BVHAggregate::buildRecursive(std::vector<pstd::pmr::polymorphic_allocator<std::byte>,std::allocator<pstd::pmr::polymorphic_allocator<std::byte>>>&,std::vector<pbrt::BVHPrimitive,std::allocator<pbrt::BVHPrimitive>>&,int,int,std::atomic<int>*,std::atomic<int>*,std::vector<pbrt::PrimitiveHandle,std::allocator<pbrt::PrimitiveHandle>>&)::__2>
              (in_stack_fffffffffffff888,(BVHPrimitive *)in_stack_fffffffffffff880,
               (BVHPrimitive *)in_stack_fffffffffffff878,
               (anon_class_4_1_ba1d3fe8)(int)((ulong)in_stack_fffffffffffff890 >> 0x20));
    auStack_d8._4_8_ = in_stack_fffffffffffff868;
    local_110 = iVar16;
  }
LAB_007bc5e7:
  iVar17 = (int)((ulong)in_stack_fffffffffffff888 >> 0x20);
  if (in_R8D - local_110 < 0x20001) {
    local_5e8 = buildRecursive(this_00,(vector<pstd::pmr::polymorphic_allocator<std::byte>,_std::allocator<pstd::pmr::polymorphic_allocator<std::byte>_>_>
                                        *)in_RDX,
                               (vector<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_> *)
                               CONCAT44(local_110,in_R8D),(int)((ulong)in_R9 >> 0x20),(int)in_R9,
                               (atomic<int> *)totalNodes_00,unaff_retaddr,in_stack_00000008);
    local_5e0 = buildRecursive(this_00,(vector<pstd::pmr::polymorphic_allocator<std::byte>,_std::allocator<pstd::pmr::polymorphic_allocator<std::byte>_>_>
                                        *)in_RDX,
                               (vector<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_> *)
                               CONCAT44(local_110,in_R8D),(int)((ulong)in_R9 >> 0x20),(int)in_R9,
                               (atomic<int> *)totalNodes_00,unaff_retaddr,in_stack_00000008);
  }
  else {
    in_stack_fffffffffffff880 = (anon_class_8_2_19ee5c4b)local_608;
    std::function<void(long)>::
    function<pbrt::BVHAggregate::buildRecursive(std::vector<pstd::pmr::polymorphic_allocator<std::byte>,std::allocator<pstd::pmr::polymorphic_allocator<std::byte>>>&,std::vector<pbrt::BVHPrimitive,std::allocator<pbrt::BVHPrimitive>>&,int,int,std::atomic<int>*,std::atomic<int>*,std::vector<pbrt::PrimitiveHandle,std::allocator<pbrt::PrimitiveHandle>>&)::__0,void>
              ((function<void_(long)> *)in_stack_fffffffffffff870,
               (anon_class_80_10_2e0851f7 *)auStack_d8._4_8_);
    ParallelFor(CONCAT44(in_stack_fffffffffffff8b4,in_stack_fffffffffffff8b0),
                (int64_t)in_stack_fffffffffffff8a8,
                (function<void_(long)> *)in_stack_fffffffffffff8a0);
    std::function<void_(long)>::~function((function<void_(long)> *)0x7bc6dc);
  }
  BVHBuildNode::InitInterior
            (in_stack_fffffffffffff890,iVar17,(BVHBuildNode *)in_stack_fffffffffffff880,
             in_stack_fffffffffffff878);
  return local_88;
}

Assistant:

BVHBuildNode *BVHAggregate::buildRecursive(std::vector<Allocator> &threadAllocators,
                                           std::vector<BVHPrimitive> &bvhPrimitives,
                                           int start, int end,
                                           std::atomic<int> *totalNodes,
                                           std::atomic<int> *orderedPrimsOffset,
                                           std::vector<PrimitiveHandle> &orderedPrims) {
    DCHECK_NE(start, end);
    Allocator alloc = threadAllocators[ThreadIndex];
    BVHBuildNode *node = alloc.new_object<BVHBuildNode>();
    // Initialize _BVHBuildNode_ for primitive range
    ++*totalNodes;
    // Compute bounds of all primitives in BVH node
    Bounds3f bounds;
    for (int i = start; i < end; ++i)
        bounds = Union(bounds, bvhPrimitives[i].bounds);

    int nPrimitives = end - start;
    if (bounds.SurfaceArea() == 0 || nPrimitives == 1) {
        // Create leaf _BVHBuildNode_
        int firstPrimOffset = orderedPrimsOffset->fetch_add(nPrimitives);
        for (int i = start; i < end; ++i) {
            int index = bvhPrimitives[i].primitiveIndex;
            orderedPrims[firstPrimOffset + i - start] = primitives[index];
        }
        node->InitLeaf(firstPrimOffset, nPrimitives, bounds);
        return node;

    } else {
        // Compute bound of primitive centroids, choose split dimension _dim_
        Bounds3f centroidBounds;
        for (int i = start; i < end; ++i)
            centroidBounds = Union(centroidBounds, bvhPrimitives[i].centroid);
        int dim = centroidBounds.MaxDimension();

        // Partition primitives into two sets and build children
        int mid = (start + end) / 2;
        if (centroidBounds.pMax[dim] == centroidBounds.pMin[dim]) {
            // Create leaf _BVHBuildNode_
            int firstPrimOffset = orderedPrimsOffset->fetch_add(nPrimitives);
            for (int i = start; i < end; ++i) {
                int index = bvhPrimitives[i].primitiveIndex;
                orderedPrims[firstPrimOffset + i - start] = primitives[index];
            }
            node->InitLeaf(firstPrimOffset, nPrimitives, bounds);
            return node;

        } else {
            // Partition primitives based on _splitMethod_
            switch (splitMethod) {
            case SplitMethod::Middle: {
                // Partition primitives through node's midpoint
                Float pmid = (centroidBounds.pMin[dim] + centroidBounds.pMax[dim]) / 2;
                BVHPrimitive *midPtr =
                    std::partition(&bvhPrimitives[start], &bvhPrimitives[end - 1] + 1,
                                   [dim, pmid](const BVHPrimitive &pi) {
                                       return pi.centroid[dim] < pmid;
                                   });
                mid = midPtr - &bvhPrimitives[0];
                // For lots of prims with large overlapping bounding boxes, this
                // may fail to partition; in that case don't break and fall through
                // to EqualCounts.
                if (mid != start && mid != end)
                    break;
            }
            case SplitMethod::EqualCounts: {
                // Partition primitives into equally sized subsets
                mid = (start + end) / 2;
                std::nth_element(&bvhPrimitives[start], &bvhPrimitives[mid],
                                 &bvhPrimitives[end - 1] + 1,
                                 [dim](const BVHPrimitive &a, const BVHPrimitive &b) {
                                     return a.centroid[dim] < b.centroid[dim];
                                 });

                break;
            }
            case SplitMethod::SAH:
            default: {
                // Partition primitives using approximate SAH
                if (nPrimitives <= 2) {
                    // Partition primitives into equally sized subsets
                    mid = (start + end) / 2;
                    std::nth_element(&bvhPrimitives[start], &bvhPrimitives[mid],
                                     &bvhPrimitives[end - 1] + 1,
                                     [dim](const BVHPrimitive &a, const BVHPrimitive &b) {
                                         return a.centroid[dim] < b.centroid[dim];
                                     });

                } else {
                    // Allocate _BVHSplitBucket_ for SAH partition buckets
                    constexpr int nBuckets = 12;
                    BVHSplitBucket buckets[nBuckets];

                    // Initialize _BVHSplitBucket_ for SAH partition buckets
                    for (int i = start; i < end; ++i) {
                        int b = nBuckets *
                                centroidBounds.Offset(bvhPrimitives[i].centroid)[dim];
                        if (b == nBuckets)
                            b = nBuckets - 1;
                        DCHECK_GE(b, 0);
                        DCHECK_LT(b, nBuckets);
                        buckets[b].count++;
                        buckets[b].bounds =
                            Union(buckets[b].bounds, bvhPrimitives[i].bounds);
                    }

                    // Compute costs for splitting after each bucket
                    constexpr int nSplits = nBuckets - 1;
                    int countBelow[nSplits], countAbove[nSplits];
                    Bounds3f boundsBelow[nSplits], boundsAbove[nSplits];
                    // Initialize _countBelow_ and _boundsBelow_ using a forward scan over
                    // splits
                    countBelow[0] = buckets[0].count;
                    boundsBelow[0] = buckets[0].bounds;
                    for (int i = 1; i < nSplits; ++i) {
                        countBelow[i] = countBelow[i - 1] + buckets[i].count;
                        boundsBelow[i] = Union(boundsBelow[i - 1], buckets[i].bounds);
                    }

                    // Initialize _countAbove_ and _boundsAbove_ using a backwards scan
                    // over splits
                    countAbove[nSplits - 1] = buckets[nBuckets - 1].count;
                    boundsAbove[nSplits - 1] = buckets[nBuckets - 1].bounds;
                    for (int i = nSplits - 2; i >= 0; --i) {
                        countAbove[i] = countAbove[i + 1] + buckets[i + 1].count;
                        boundsAbove[i] = Union(boundsAbove[i + 1], buckets[i + 1].bounds);
                    }

                    // Find bucket to split at that minimizes SAH metric
                    int minCostSplitBucket = -1;
                    Float minCost = Infinity;
                    for (int i = 0; i < nSplits; ++i) {
                        // Compute cost for candidate split and update minimum if
                        // necessary
                        if (countBelow[i] == 0 || countAbove[i] == 0)
                            continue;
                        Float cost = (countBelow[i] * boundsBelow[i].SurfaceArea() +
                                      countAbove[i] * boundsAbove[i].SurfaceArea());
                        if (cost < minCost) {
                            minCost = cost;
                            minCostSplitBucket = i;
                        }
                    }
                    // Compute leaf cost and SAH split cost for chosen split
                    Float leafCost = nPrimitives;
                    minCost = 1.f / 2.f + minCost / bounds.SurfaceArea();

                    // Either create leaf or split primitives at selected SAH bucket
                    if (nPrimitives > maxPrimsInNode || minCost < leafCost) {
                        BVHPrimitive *pmid = std::partition(
                            &bvhPrimitives[start], &bvhPrimitives[end - 1] + 1,
                            [=](const BVHPrimitive &bp) {
                                int b =
                                    nBuckets * centroidBounds.Offset(bp.centroid)[dim];
                                if (b == nBuckets)
                                    b = nBuckets - 1;
                                return b <= minCostSplitBucket;
                            });
                        mid = pmid - &bvhPrimitives[0];
                    } else {
                        // Create leaf _BVHBuildNode_
                        int firstPrimOffset = orderedPrimsOffset->fetch_add(nPrimitives);
                        for (int i = start; i < end; ++i) {
                            int index = bvhPrimitives[i].primitiveIndex;
                            orderedPrims[firstPrimOffset + i - start] = primitives[index];
                        }
                        node->InitLeaf(firstPrimOffset, nPrimitives, bounds);
                        return node;
                    }
                }

                break;
            }
            }

            BVHBuildNode *children[2];
            // Recursively build BVHs for _children_
            if (end - start > 128 * 1024) {
                // Recursively build child BVHs in parallel
                ParallelFor(0, 2, [&](int i) {
                    if (i == 0)
                        children[0] =
                            buildRecursive(threadAllocators, bvhPrimitives, start, mid,
                                           totalNodes, orderedPrimsOffset, orderedPrims);
                    else
                        children[1] =
                            buildRecursive(threadAllocators, bvhPrimitives, mid, end,
                                           totalNodes, orderedPrimsOffset, orderedPrims);
                });

            } else {
                // Recursively build child BVHs sequentially
                children[0] =
                    buildRecursive(threadAllocators, bvhPrimitives, start, mid,
                                   totalNodes, orderedPrimsOffset, orderedPrims);
                children[1] =
                    buildRecursive(threadAllocators, bvhPrimitives, mid, end, totalNodes,
                                   orderedPrimsOffset, orderedPrims);
            }

            node->InitInterior(dim, children[0], children[1]);
        }
    }

    return node;
}